

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

bool __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Push
          (PageStack<Memory::MarkContext::MarkCandidate> *this,MarkCandidate item)

{
  undefined4 *puVar1;
  MarkCandidate *pMVar2;
  code *pcVar3;
  bool bVar4;
  Chunk *pCVar5;
  Chunk *pCVar6;
  size_t sVar7;
  Chunk *pCVar8;
  undefined8 *in_FS_OFFSET;
  
  pCVar6 = (Chunk *)this->nextEntry;
  pCVar5 = (Chunk *)this->chunkEnd;
  if (pCVar6 == pCVar5) {
    pCVar5 = CreateChunk(this);
    if (pCVar5 == (Chunk *)0x0) {
      return false;
    }
    pCVar5->nextChunk = this->currentChunk;
    this->currentChunk = pCVar5;
    pCVar6 = pCVar5 + 1;
    this->chunkStart = (MarkCandidate *)pCVar6;
    pCVar5 = pCVar5 + 0x80;
    this->chunkEnd = (MarkCandidate *)pCVar5;
    this->nextEntry = (MarkCandidate *)pCVar6;
    pCVar8 = pCVar6;
  }
  else {
    pCVar8 = (Chunk *)this->chunkStart;
  }
  if (pCVar6 < pCVar8 || pCVar5 <= pCVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x84,"(nextEntry >= chunkStart && nextEntry < chunkEnd)",
                       "nextEntry >= chunkStart && nextEntry < chunkEnd");
    if (!bVar4) goto LAB_0026c600;
    *puVar1 = 0;
    pCVar6 = (Chunk *)this->nextEntry;
  }
  (pCVar6->super_PagePoolPage).pageAllocator = (PageAllocator *)item.obj;
  (pCVar6->super_PagePoolPage).pageSegment = (PageSegment *)item.byteCount;
  pMVar2 = this->nextEntry;
  this->nextEntry = pMVar2 + 1;
  sVar7 = this->count + 1;
  this->count = sVar7;
  if (sVar7 != (((long)(pMVar2 + 1) - (long)this->chunkStart >> 4) + this->pageCount * 0xfe) - 0xfe)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x8b,
                       "(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk)",
                       "count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk");
    if (!bVar4) {
LAB_0026c600:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  return true;
}

Assistant:

inline
bool PageStack<T>::Push(T item)
{
    if (nextEntry == chunkEnd)
    {
        Chunk * newChunk = CreateChunk();
        if (newChunk == nullptr)
        {
            return false;
        }

        newChunk->nextChunk = currentChunk;
        currentChunk = newChunk;

        chunkStart = currentChunk->entries;
        chunkEnd = &currentChunk->entries[EntriesPerChunk];
        nextEntry = chunkStart;
    }

    Assert(nextEntry >= chunkStart && nextEntry < chunkEnd);

    *nextEntry = item;
    nextEntry++;

#if DBG
    count++;
    Assert(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk);
#endif

    return true;
}